

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cost.h
# Opt level: O0

int av1_cost_symbol(aom_cdf_prob p15)

{
  byte bVar1;
  uint uVar2;
  int iVar3;
  ushort in_DI;
  int prob;
  int shift;
  
  uVar2 = clamp((uint)in_DI,1,0x7fff);
  iVar3 = get_msb(uVar2 & 0xffff);
  bVar1 = get_prob((uVar2 & 0xffff) << ((byte)(0xe - iVar3) & 0x1f),0x8000);
  return (uint)av1_prob_cost[(int)(bVar1 - 0x80)] + (0xe - iVar3) * 0x200;
}

Assistant:

static inline int av1_cost_symbol(aom_cdf_prob p15) {
  // p15 can be out of range [1, CDF_PROB_TOP - 1]. Clamping it, so that the
  // following cost calculation works correctly. Otherwise, if p15 =
  // CDF_PROB_TOP, shift would be -1, and "p15 << shift" would be wrong.
  p15 = (aom_cdf_prob)clamp(p15, 1, CDF_PROB_TOP - 1);
  assert(0 < p15 && p15 < CDF_PROB_TOP);
  const int shift = CDF_PROB_BITS - 1 - get_msb(p15);
  const int prob = get_prob(p15 << shift, CDF_PROB_TOP);
  assert(prob >= 128);
  return av1_prob_cost[prob - 128] + av1_cost_literal(shift);
}